

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::analyze_meshlet_writes
          (CompilerHLSL *this,uint32_t func_id,uint32_t id_per_vertex,uint32_t id_per_primitive,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *pAVar4;
  int iVar5;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  uint32_t local_19c;
  Parameter local_174;
  Parameter local_160;
  uint32_t local_14c;
  Parameter *pPStack_148;
  uint32_t type_id;
  Parameter *arg_1;
  Parameter *__end5_1;
  Parameter *__begin5_1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range5_1;
  uint32_t var_id;
  byte local_119;
  BuiltIn builtin_type;
  bool already_declared_1;
  SPIRVariable *var;
  uint32_t local_108;
  uint32_t local_104;
  uint32_t local_100;
  undefined1 local_fc;
  Parameter *local_f8;
  Parameter *arg;
  Parameter *__end5;
  Parameter *__begin5;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range5;
  Parameter *pPStack_d0;
  bool already_declared;
  Parameter *iarg;
  Parameter *__end4;
  Parameter *__begin4;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range4;
  SPIRFunction *inner_func;
  uint32_t inner_func_id;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end2;
  Instruction *__begin2;
  SmallVector<spirv_cross::Instruction,_8UL> *__range2;
  SPIRBlock *b;
  TypedID<(spirv_cross::Types)6> *block;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  SPIRFunction *func;
  undefined1 local_40;
  _Node_iterator_base<unsigned_int,_false> local_38;
  _Node_iterator_base<unsigned_int,_false> local_30;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_28;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *processed_func_ids_local;
  uint32_t local_18;
  uint32_t id_per_primitive_local;
  uint32_t id_per_vertex_local;
  uint32_t func_id_local;
  CompilerHLSL *this_local;
  
  local_28 = processed_func_ids;
  processed_func_ids_local._4_4_ = id_per_primitive;
  local_18 = id_per_vertex;
  id_per_primitive_local = func_id;
  _id_per_vertex_local = this;
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(processed_func_ids,&id_per_primitive_local);
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(local_28);
  bVar1 = ::std::__detail::operator!=(&local_30,&local_38);
  if (!bVar1) {
    pVar6 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(local_28,&id_per_primitive_local);
    func = (SPIRFunction *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_40 = pVar6.second;
    __range1 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *)
               Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id_per_primitive_local);
    __begin1 = (TypedID<(spirv_cross::Types)6> *)&((SPIRFunction *)__range1)->blocks;
    __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_> *)__begin1);
    block = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_> *)__begin1);
    for (; __end1 != block; __end1 = __end1 + 1) {
      b = (SPIRBlock *)__end1;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      __range2 = (SmallVector<spirv_cross::Instruction,_8UL> *)
                 Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this,uVar2);
      __begin2 = (Instruction *)&((SPIRBlock *)__range2)->ops;
      __end2 = VectorView<spirv_cross::Instruction>::begin
                         ((VectorView<spirv_cross::Instruction> *)__begin2);
      i = VectorView<spirv_cross::Instruction>::end
                    ((VectorView<spirv_cross::Instruction> *)__begin2);
      for (; __end2 != i; __end2 = __end2 + 1) {
        ops = (uint32_t *)__end2;
        _inner_func_id = Compiler::stream((Compiler *)this,__end2);
        inner_func._4_4_ = (uint)(ushort)*ops;
        if (inner_func._4_4_ == 0x39) {
          inner_func._0_4_ = _inner_func_id[2];
          analyze_meshlet_writes
                    (this,(uint32_t)inner_func,local_18,processed_func_ids_local._4_4_,local_28);
          __range4 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                     Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,(uint32_t)inner_func)
          ;
          __begin4 = (Parameter *)&((SPIRFunction *)__range4)->arguments;
          __end4 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                             ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin4);
          iarg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                           ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin4);
          for (; __end4 != iarg; __end4 = __end4 + 1) {
            pPStack_d0 = __end4;
            if ((__end4->alias_global_variable & 1U) != 0) {
              __range5._7_1_ = 0;
              __begin5 = (Parameter *)&__range1->stack_storage;
              __end5 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                                 ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin5);
              arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                              ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin5);
              for (; __end5 != arg; __end5 = __end5 + 1) {
                local_f8 = __end5;
                uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end5->id);
                uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_d0->id);
                if (uVar2 == uVar3) {
                  __range5._7_1_ = 1;
                  break;
                }
              }
              if ((__range5._7_1_ & 1) == 0) {
                pAVar4 = &__range1->stack_storage;
                uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_d0->id);
                uVar2 = Compiler::expression_type_id((Compiler *)this,uVar2);
                TypedID<(spirv_cross::Types)1>::TypedID
                          ((TypedID<(spirv_cross::Types)1> *)((long)&var + 4),uVar2);
                local_108 = (pPStack_d0->id).id;
                local_104 = pPStack_d0->read_count;
                local_100 = pPStack_d0->write_count;
                local_fc = 1;
                SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back
                          ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)pAVar4,
                           (Parameter *)((long)&var + 4));
              }
            }
          }
        }
        else if (((inner_func._4_4_ - 0x3d < 2) || (inner_func._4_4_ - 0x41 < 4)) ||
                (inner_func._4_4_ == 0x46)) {
          iVar5 = 2;
          if (inner_func._4_4_ == 0x3e) {
            iVar5 = 0;
          }
          _builtin_type =
               Compiler::maybe_get<spirv_cross::SPIRVariable>
                         ((Compiler *)this,_inner_func_id[iVar5]);
          if ((_builtin_type != (SPIRVariable *)0x0) &&
             ((_builtin_type->storage == Output ||
              (_builtin_type->storage == StorageClassTaskPayloadWorkgroupEXT)))) {
            local_119 = 0;
            __range5_1._4_4_ = (_builtin_type->super_IVariant).self.id;
            var_id = Compiler::get_decoration((Compiler *)this,__range5_1._4_4_,BuiltIn);
            __range5_1._0_4_ =
                 TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(_builtin_type->super_IVariant).self);
            if ((_builtin_type->storage != StorageClassTaskPayloadWorkgroupEXT) &&
               (((var_id != 0x14ae && (var_id != 0x14af)) && (var_id != 0x14b0)))) {
              bVar1 = CompilerGLSL::is_per_primitive_variable
                                (&this->super_CompilerGLSL,_builtin_type);
              if (bVar1) {
                local_19c = processed_func_ids_local._4_4_;
              }
              else {
                local_19c = local_18;
              }
              __range5_1._0_4_ = local_19c;
            }
            __begin5_1 = (Parameter *)&__range1->stack_storage;
            __end5_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                                 ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin5_1);
            arg_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                              ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin5_1);
            for (; __end5_1 != arg_1; __end5_1 = __end5_1 + 1) {
              pPStack_148 = __end5_1;
              uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end5_1->id);
              if (uVar2 == (uint32_t)__range5_1) {
                local_119 = 1;
                break;
              }
            }
            if ((local_119 & 1) == 0) {
              local_14c = Compiler::expression_type_id((Compiler *)this,(uint32_t)__range5_1);
              if (_builtin_type->storage == StorageClassTaskPayloadWorkgroupEXT) {
                pAVar4 = &__range1->stack_storage;
                TypedID<(spirv_cross::Types)1>::TypedID(&local_160.type,local_14c);
                TypedID<(spirv_cross::Types)0>::TypedID(&local_160.id,(uint32_t)__range5_1);
                local_160.read_count = 1;
                local_160.write_count = 0;
                local_160.alias_global_variable = true;
                SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back
                          ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)pAVar4,
                           &local_160);
              }
              else {
                pAVar4 = &__range1->stack_storage;
                TypedID<(spirv_cross::Types)1>::TypedID(&local_174.type,local_14c);
                TypedID<(spirv_cross::Types)0>::TypedID(&local_174.id,(uint32_t)__range5_1);
                local_174.read_count = 1;
                local_174.write_count = 1;
                local_174.alias_global_variable = true;
                SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back
                          ((SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)pAVar4,
                           &local_174);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerHLSL::analyze_meshlet_writes(uint32_t func_id, uint32_t id_per_vertex, uint32_t id_per_primitive,
                                          std::unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
		return;
	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);
	// Recursively establish global args added to functions on which we depend.
	for (auto& block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpFunctionCall:
			{
				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				analyze_meshlet_writes(inner_func_id, id_per_vertex, id_per_primitive, processed_func_ids);
				auto &inner_func = get<SPIRFunction>(inner_func_id);
				for (auto &iarg : inner_func.arguments)
				{
					if (!iarg.alias_global_variable)
						continue;

					bool already_declared = false;
					for (auto &arg : func.arguments)
					{
						if (arg.id == iarg.id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						func.arguments.push_back({ expression_type_id(iarg.id), iarg.id,
						                           iarg.read_count, iarg.write_count, true });
					}
				}
				break;
			}

			case OpStore:
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpInBoundsPtrAccessChain:
			case OpArrayLength:
			{
				auto *var = maybe_get<SPIRVariable>(ops[op == OpStore ? 0 : 2]);
				if (var && (var->storage == StorageClassOutput || var->storage == StorageClassTaskPayloadWorkgroupEXT))
				{
					bool already_declared = false;
					auto builtin_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

					uint32_t var_id = var->self;
					if (var->storage != StorageClassTaskPayloadWorkgroupEXT &&
						builtin_type != BuiltInPrimitivePointIndicesEXT &&
						builtin_type != BuiltInPrimitiveLineIndicesEXT &&
						builtin_type != BuiltInPrimitiveTriangleIndicesEXT)
					{
						var_id = is_per_primitive_variable(*var) ? id_per_primitive : id_per_vertex;
					}

					for (auto &arg : func.arguments)
					{
						if (arg.id == var_id)
						{
							already_declared = true;
							break;
						}
					}

					if (!already_declared)
					{
						// basetype is effectively ignored here since we declare the argument
						// with explicit types. Just pass down a valid type.
						uint32_t type_id = expression_type_id(var_id);
						if (var->storage == StorageClassTaskPayloadWorkgroupEXT)
							func.arguments.push_back({ type_id, var_id, 1u, 0u, true });
						else
							func.arguments.push_back({ type_id, var_id, 1u, 1u, true });
					}
				}
				break;
			}

			default:
				break;
			}
		}
	}
}